

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall
QPDFJob::getUOPagenos
          (QPDFJob *this,vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *uos,
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          *pagenos)

{
  pointer piVar1;
  pointer piVar2;
  mapped_type *pmVar3;
  vector<int,std::allocator<int>> *this_00;
  ulong uVar4;
  ulong uVar5;
  int *__args;
  ulong uVar6;
  pointer pUVar7;
  iterator __position;
  ulong uVar8;
  pointer piVar9;
  int to_pageno;
  size_t uo_idx;
  int local_64;
  key_type_conflict local_60;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  *local_58;
  pointer local_50;
  ulong local_48;
  pointer local_40;
  pointer local_38;
  
  local_60 = 0;
  pUVar7 = (uos->super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_50 = (uos->super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = pagenos;
  if (pUVar7 != local_50) {
    do {
      piVar9 = (pUVar7->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (pUVar7->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar9 != piVar1) {
        uVar6 = (long)(pUVar7->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pUVar7->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        local_38 = (pUVar7->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        local_40 = (pUVar7->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_48 = (long)local_38 - (long)local_40 >> 2;
        uVar8 = 0;
        do {
          local_64 = *piVar9;
          if (uVar8 < uVar6) {
            pmVar3 = std::
                     map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                     ::operator[](local_58,&local_64);
            this_00 = (vector<int,std::allocator<int>> *)
                      std::
                      map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](pmVar3,&local_60);
            piVar2 = (pUVar7->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar4 = (long)(pUVar7->from_pagenos).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            uVar5 = uVar8;
            if (uVar4 <= uVar8) {
LAB_00184444:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar5,uVar4);
            }
            __args = piVar2 + uVar8;
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(pointer *)(this_00 + 0x10)) {
LAB_001843f0:
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,__position,__args);
            }
            else {
              *__position._M_current = *__args;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          else if (local_38 != local_40) {
            pmVar3 = std::
                     map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                     ::operator[](local_58,&local_64);
            this_00 = (vector<int,std::allocator<int>> *)
                      std::
                      map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](pmVar3,&local_60);
            uVar5 = (uVar8 - uVar6) % local_48;
            piVar2 = (pUVar7->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar4 = (long)(pUVar7->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            if (uVar4 <= uVar5) goto LAB_00184444;
            __args = piVar2 + uVar5;
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(pointer *)(this_00 + 0x10)) goto LAB_001843f0;
            *__position._M_current = *__args;
            *(int **)(this_00 + 8) = __position._M_current + 1;
          }
          uVar8 = uVar8 + 1;
          piVar9 = piVar9 + 1;
        } while (piVar9 != piVar1);
      }
      local_60 = local_60 + 1;
      pUVar7 = pUVar7 + 1;
    } while (pUVar7 != local_50);
  }
  return;
}

Assistant:

void
QPDFJob::getUOPagenos(
    std::vector<QPDFJob::UnderOverlay>& uos,
    std::map<int, std::map<size_t, std::vector<int>>>& pagenos)
{
    size_t uo_idx = 0;
    for (auto const& uo: uos) {
        size_t page_idx = 0;
        size_t from_size = uo.from_pagenos.size();
        size_t repeat_size = uo.repeat_pagenos.size();
        for (int to_pageno: uo.to_pagenos) {
            if (page_idx < from_size) {
                pagenos[to_pageno][uo_idx].push_back(uo.from_pagenos.at(page_idx));
            } else if (repeat_size) {
                pagenos[to_pageno][uo_idx].push_back(
                    uo.repeat_pagenos.at((page_idx - from_size) % repeat_size));
            }
            ++page_idx;
        }
        ++uo_idx;
    }
}